

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::ContinuousAssignSyntax::ContinuousAssignSyntax
          (ContinuousAssignSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token assign,
          DriveStrengthSyntax *strength,TimingControlSyntax *delay,
          SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *assignments,Token semi)

{
  bool bVar1;
  ExpressionSyntax *pEVar2;
  SyntaxNode *in_RCX;
  SyntaxNode *in_RDX;
  SyntaxNode *in_RDI;
  undefined8 in_R8;
  SyntaxNode *in_R9;
  ExpressionSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *__range2;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *in_stack_ffffffffffffff88;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *this_00;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *local_58;
  undefined1 in_stack_ffffffffffffffb8 [16];
  
  this_00 = (SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)&stack0x00000010;
  MemberSyntax::MemberSyntax
            (in_stack_ffffffffffffffb8._8_8_,in_stack_ffffffffffffffb8._4_4_,local_58);
  in_RDI[3].parent = in_RDX;
  in_RDI[3].previewNode = in_RCX;
  *(undefined8 *)(in_RDI + 4) = in_R8;
  in_RDI[4].parent = in_R9;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::SeparatedSyntaxList
            (this_00,in_stack_ffffffffffffff88);
  *(_func_int ***)(in_RDI + 7) = (this_00->super_SyntaxListBase)._vptr_SyntaxListBase;
  in_RDI[7].parent = *(SyntaxNode **)&(this_00->super_SyntaxListBase).super_SyntaxNode;
  if (*(long *)(in_RDI + 4) != 0) {
    *(SyntaxNode **)(*(long *)(in_RDI + 4) + 8) = in_RDI;
  }
  if (in_RDI[4].parent != (SyntaxNode *)0x0) {
    (in_RDI[4].parent)->parent = in_RDI;
  }
  in_RDI[5].parent = in_RDI;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)0xa26395);
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::end(this_00);
  while( true ) {
    bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>_>
                      ((self_type *)this_00,
                       (iterator_base<slang::syntax::ExpressionSyntax_*> *)in_stack_ffffffffffffff88
                      );
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pEVar2 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_false>
             ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_false>
                          *)0xa263d4);
    (pEVar2->super_SyntaxNode).parent = in_RDI;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_false>
                *)this_00);
  }
  return;
}

Assistant:

ContinuousAssignSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token assign, DriveStrengthSyntax* strength, TimingControlSyntax* delay, const SeparatedSyntaxList<ExpressionSyntax>& assignments, Token semi) :
        MemberSyntax(SyntaxKind::ContinuousAssign, attributes), assign(assign), strength(strength), delay(delay), assignments(assignments), semi(semi) {
        if (this->strength) this->strength->parent = this;
        if (this->delay) this->delay->parent = this;
        this->assignments.parent = this;
        for (auto child : this->assignments)
            child->parent = this;
    }